

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O0

char * getResource(char *fmt,...)

{
  char in_AL;
  char *pcVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 auStack_d8 [8];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  char *local_8;
  
  local_18 = auStack_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_20 = &stack0x00000008;
  local_24 = 0x30;
  local_28 = 8;
  local_d0 = in_RSI;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  local_8 = in_RDI;
  memset(getResource::res,0,0x200);
  snprintf(getResource::res,0x1ff,local_8,&local_28);
  if (getResource::dir == (ALLEGRO_PATH *)0x0) {
    getResource::dir = getDir();
  }
  if (getResource::path != (ALLEGRO_PATH *)0x0) {
    al_destroy_path(getResource::path);
  }
  getResource::path = (ALLEGRO_PATH *)al_create_path(getResource::res);
  al_rebase_path(getResource::dir,getResource::path);
  pcVar1 = (char *)al_path_cstr(getResource::path,0x2f);
  return pcVar1;
}

Assistant:

const char* getResource(const char* fmt, ...)
{
   va_list ap;
   static char res[512];
   static ALLEGRO_PATH *dir;
   static ALLEGRO_PATH *path;

   va_start(ap, fmt);
   memset(res, 0, 512);
   snprintf(res, 511, fmt, ap);

   if (!dir)
      dir = getDir();

   if (path)
      al_destroy_path(path);

   path = al_create_path(res);
   al_rebase_path(dir, path);
   return al_path_cstr(path, '/');
}